

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsReadOnlyPointerShaders(Instruction *this)

{
  bool bVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  DecorationManager *this_02;
  bool is_nonwritable;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  uVar2 = type_id(this);
  if (uVar2 == 0) {
    return false;
  }
  this_00 = IRContext::get_def_use_mgr(this->context_);
  uVar2 = type_id(this);
  this_01 = analysis::DefUseManager::GetDef(this_00,uVar2);
  if (this_01->opcode_ != OpTypePointer) {
    return false;
  }
  uVar2 = GetSingleWordInOperand(this_01,0);
  switch(uVar2) {
  case 0:
    bVar1 = IsVulkanStorageImage(this_01);
    if (bVar1) goto switchD_001f8a63_caseD_3;
    bVar1 = IsVulkanStorageTexelBuffer(this_01);
    break;
  case 1:
  case 9:
    return true;
  case 2:
    bVar1 = IsVulkanStorageBuffer(this_01);
    break;
  default:
    goto switchD_001f8a63_caseD_3;
  }
  if (bVar1 == false) {
    return true;
  }
switchD_001f8a63_caseD_3:
  is_nonwritable = false;
  this_02 = IRContext::get_decoration_mgr(this->context_);
  uVar2 = result_id(this);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:500:7)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:500:7)>
             ::_M_manager;
  local_40._M_unused._M_object = &is_nonwritable;
  analysis::DecorationManager::ForEachDecoration
            (this_02,uVar2,0x18,(function<void_(const_spvtools::opt::Instruction_&)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
    return is_nonwritable;
  }
  return is_nonwritable;
}

Assistant:

bool Instruction::IsReadOnlyPointerShaders() const {
  if (type_id() == 0) {
    return false;
  }

  Instruction* type_def = context()->get_def_use_mgr()->GetDef(type_id());
  if (type_def->opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class = spv::StorageClass(
      type_def->GetSingleWordInOperand(kPointerTypeStorageClassIndex));

  switch (storage_class) {
    case spv::StorageClass::UniformConstant:
      if (!type_def->IsVulkanStorageImage() &&
          !type_def->IsVulkanStorageTexelBuffer()) {
        return true;
      }
      break;
    case spv::StorageClass::Uniform:
      if (!type_def->IsVulkanStorageBuffer()) {
        return true;
      }
      break;
    case spv::StorageClass::PushConstant:
    case spv::StorageClass::Input:
      return true;
    default:
      break;
  }

  bool is_nonwritable = false;
  context()->get_decoration_mgr()->ForEachDecoration(
      result_id(), uint32_t(spv::Decoration::NonWritable),
      [&is_nonwritable](const Instruction&) { is_nonwritable = true; });
  return is_nonwritable;
}